

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imcompress.c
# Opt level: O0

int fits_read_compressed_img
              (fitsfile *fptr,int datatype,LONGLONG *infpixel,LONGLONG *inlpixel,long *ininc,
              int nullcheck,void *nullval,void *array,char *nullarray,int *anynul,int *status)

{
  double dVar1;
  int iVar2;
  long lVar3;
  char *tile;
  long *tfpixel_00;
  long *tlpixel_00;
  char *bnullarray_00;
  long in_RCX;
  long in_RDX;
  int in_ESI;
  long in_RDI;
  long in_R8;
  int in_R9D;
  undefined1 auVar4 [16];
  double *in_stack_00000008;
  undefined4 *in_stack_00000020;
  int *in_stack_00000028;
  double testnullval;
  char *bnullarray;
  void *buffer;
  int tilenul;
  int pixlen;
  int ndim;
  int ii;
  long irow;
  long i0;
  long i1;
  long i2;
  long i3;
  long i4;
  long i5;
  long inc [6];
  long lpixel [6];
  long fpixel [6];
  long ntemp;
  long offset [6];
  long rowdim [6];
  long tlpixel [6];
  long tfpixel [6];
  long ltile [6];
  long ftile [6];
  long thistilesize [6];
  long tilesize [6];
  long tiledim [6];
  long naxis [6];
  fitsfile *in_stack_fffffffffffffc58;
  char *local_370;
  long local_368;
  long local_360;
  long local_358;
  char *local_350;
  long local_348;
  long local_340;
  double local_338;
  void *local_330;
  void *local_328;
  int local_314;
  char *local_308;
  int *local_300;
  long local_2f8;
  long local_2f0;
  long local_2e8;
  long local_2e0;
  long *in_stack_fffffffffffffd28;
  int in_stack_fffffffffffffd30;
  int in_stack_fffffffffffffd34;
  int in_stack_fffffffffffffd38;
  int in_stack_fffffffffffffd3c;
  fitsfile *in_stack_fffffffffffffd40;
  long *in_stack_fffffffffffffd48;
  int in_stack_fffffffffffffd50;
  long local_2a8;
  int *in_stack_fffffffffffffd60;
  char *in_stack_fffffffffffffd68;
  int *in_stack_fffffffffffffd70;
  int *in_stack_fffffffffffffd78;
  long local_278 [7];
  long local_240;
  long local_230;
  long local_228;
  long local_220;
  long local_218;
  long local_210;
  long alStack_208 [6];
  char *local_1d8;
  long local_1d0;
  long local_1c8;
  long local_1c0;
  char *local_1b8;
  long local_1b0;
  long local_178;
  char *in_stack_fffffffffffffe90;
  long *in_stack_fffffffffffffe98;
  long *in_stack_fffffffffffffea0;
  long *in_stack_fffffffffffffea8;
  int in_stack_fffffffffffffeb0;
  undefined4 uStack_14c;
  char *in_stack_fffffffffffffeb8;
  char *nullarray_00;
  int *in_stack_fffffffffffffec0;
  int *status_00;
  long local_138;
  long local_130;
  long local_128;
  long local_120;
  long local_e8 [6];
  long alStack_b8 [6];
  char *local_88;
  long local_80;
  long local_78;
  long local_70;
  char *local_68;
  long local_60;
  int local_54;
  long local_50;
  long local_48;
  long local_40;
  int local_34;
  long local_30;
  int local_24;
  
  local_330 = (void *)0x0;
  local_338 = 0.0;
  if (*in_stack_00000028 < 1) {
    local_54 = in_R9D;
    local_50 = in_R8;
    local_48 = in_RCX;
    local_40 = in_RDX;
    local_34 = in_ESI;
    local_30 = in_RDI;
    iVar2 = fits_is_compressed_image(in_stack_fffffffffffffc58,(int *)0x1fd39a);
    if (iVar2 == 0) {
      ffpmsg((char *)0x1fd3ab);
      *in_stack_00000028 = 0x19e;
      local_24 = 0x19e;
    }
    else {
      if (local_34 == 0x15) {
        local_328 = malloc(*(long *)(*(long *)(local_30 + 8) + 0x4c8) << 1);
        local_308 = in_stack_fffffffffffffeb8;
        local_300 = in_stack_fffffffffffffec0;
        if (in_stack_00000008 != (double *)0x0) {
          local_338 = (double)(int)*(short *)in_stack_00000008;
        }
      }
      else if (local_34 == 0x1f) {
        local_328 = malloc(*(long *)(*(long *)(local_30 + 8) + 0x4c8) << 2);
        local_308 = in_stack_fffffffffffffeb8;
        local_300 = in_stack_fffffffffffffec0;
        if (in_stack_00000008 != (double *)0x0) {
          local_338 = (double)(int)*(float *)in_stack_00000008;
        }
      }
      else if (local_34 == 0x29) {
        local_328 = malloc(*(long *)(*(long *)(local_30 + 8) + 0x4c8) << 3);
        local_308 = in_stack_fffffffffffffeb8;
        local_300 = in_stack_fffffffffffffec0;
        if (in_stack_00000008 != (double *)0x0) {
          local_338 = (double)(long)*in_stack_00000008;
        }
      }
      else if (local_34 == 0x2a) {
        local_328 = malloc(*(long *)(*(long *)(local_30 + 8) + 0x4c8) << 2);
        local_308 = in_stack_fffffffffffffeb8;
        local_300 = in_stack_fffffffffffffec0;
        if (in_stack_00000008 != (double *)0x0) {
          local_338 = (double)*(float *)in_stack_00000008;
        }
      }
      else if (local_34 == 0x52) {
        local_328 = malloc(*(long *)(*(long *)(local_30 + 8) + 0x4c8) << 3);
        local_308 = in_stack_fffffffffffffeb8;
        local_300 = in_stack_fffffffffffffec0;
        if (in_stack_00000008 != (double *)0x0) {
          local_338 = *in_stack_00000008;
        }
      }
      else if (local_34 == 0x14) {
        local_328 = malloc(*(long *)(*(long *)(local_30 + 8) + 0x4c8) << 1);
        local_308 = in_stack_fffffffffffffeb8;
        local_300 = in_stack_fffffffffffffec0;
        if (in_stack_00000008 != (double *)0x0) {
          local_338 = (double)*(ushort *)in_stack_00000008;
        }
      }
      else if (local_34 == 0x1e) {
        local_328 = malloc(*(long *)(*(long *)(local_30 + 8) + 0x4c8) << 2);
        local_308 = in_stack_fffffffffffffeb8;
        local_300 = in_stack_fffffffffffffec0;
        if (in_stack_00000008 != (double *)0x0) {
          local_338 = (double)(uint)*(float *)in_stack_00000008;
        }
      }
      else if (local_34 == 0x28) {
        local_328 = malloc(*(long *)(*(long *)(local_30 + 8) + 0x4c8) << 3);
        local_308 = in_stack_fffffffffffffeb8;
        local_300 = in_stack_fffffffffffffec0;
        if (in_stack_00000008 != (double *)0x0) {
          dVar1 = *in_stack_00000008;
          auVar4._8_4_ = (int)((ulong)dVar1 >> 0x20);
          auVar4._0_8_ = dVar1;
          auVar4._12_4_ = 0x45300000;
          local_338 = (auVar4._8_8_ - 1.9342813113834067e+25) +
                      ((double)CONCAT44(0x43300000,SUB84(dVar1,0)) - 4503599627370496.0);
        }
      }
      else {
        if ((local_34 != 0xb) && (local_34 != 0xc)) {
          ffpmsg((char *)0x1fd740);
          *in_stack_00000028 = 0x19a;
          return 0x19a;
        }
        local_328 = malloc(*(size_t *)(*(long *)(local_30 + 8) + 0x4c8));
        local_308 = in_stack_fffffffffffffeb8;
        local_300 = in_stack_fffffffffffffec0;
        if (in_stack_00000008 != (double *)0x0) {
          local_338 = (double)*(byte *)in_stack_00000008;
        }
      }
      if (((local_54 == 1) && (local_338 == 0.0)) && (!NAN(local_338))) {
        local_54 = 0;
      }
      if (local_328 == (void *)0x0) {
        ffpmsg((char *)0x1fd7ab);
        *in_stack_00000028 = 0x71;
        local_24 = 0x71;
      }
      else if ((local_54 == 2) &&
              (local_330 = calloc(*(size_t *)(*(long *)(local_30 + 8) + 0x4c8),1),
              local_330 == (void *)0x0)) {
        ffpmsg((char *)0x1fd809);
        free(local_328);
        *in_stack_00000028 = 0x71;
        local_24 = 0x71;
      }
      else {
        for (local_314 = 0; local_314 < 6; local_314 = local_314 + 1) {
          (&local_88)[local_314] = (char *)0x1;
          alStack_b8[local_314] = 1;
          local_e8[local_314] = 1;
          *(undefined8 *)(&stack0xfffffffffffffeb8 + (long)local_314 * 8) = 1;
          (&local_178)[local_314] = 1;
          alStack_208[local_314] = 1;
        }
        iVar2 = *(int *)(*(long *)(local_30 + 8) + 0x490);
        local_240 = 1;
        for (local_314 = 0; local_314 < iVar2; local_314 = local_314 + 1) {
          if (*(long *)(local_48 + (long)local_314 * 8) < *(long *)(local_40 + (long)local_314 * 8))
          {
            local_278[local_314] = *(long *)(local_48 + (long)local_314 * 8);
            (&local_2a8)[local_314] = *(long *)(local_40 + (long)local_314 * 8);
            *(long *)(&stack0xfffffffffffffd28 + (long)local_314 * 8) =
                 -*(long *)(local_50 + (long)local_314 * 8);
          }
          else {
            local_278[local_314] = *(long *)(local_40 + (long)local_314 * 8);
            (&local_2a8)[local_314] = *(long *)(local_48 + (long)local_314 * 8);
            *(undefined8 *)(&stack0xfffffffffffffd28 + (long)local_314 * 8) =
                 *(undefined8 *)(local_50 + (long)local_314 * 8);
          }
          (&local_88)[local_314] = *(char **)(*(long *)(local_30 + 8) + 0x498 + (long)local_314 * 8)
          ;
          if (local_278[local_314] < 1) {
            if (local_54 == 2) {
              free(local_330);
            }
            free(local_328);
            *in_stack_00000028 = 0x141;
            return 0x141;
          }
          local_e8[local_314] = *(long *)(*(long *)(local_30 + 8) + 0x440 + (long)local_314 * 8);
          alStack_b8[local_314] = (long)((&local_88)[local_314] + -1) / local_e8[local_314] + 1;
          *(long *)(&stack0xfffffffffffffeb8 + (long)local_314 * 8) =
               (local_278[local_314] + -1) / local_e8[local_314] + 1;
          if (((&local_2a8)[local_314] + -1) / local_e8[local_314] + 1 < alStack_b8[local_314]) {
            local_340 = ((&local_2a8)[local_314] + -1) / local_e8[local_314] + 1;
          }
          else {
            local_340 = alStack_b8[local_314];
          }
          (&local_178)[local_314] = local_340;
          alStack_208[local_314] = local_240;
          local_240 = alStack_b8[local_314] * local_240;
        }
        if (in_stack_00000020 != (undefined4 *)0x0) {
          *in_stack_00000020 = 0;
        }
        for (local_2e0 = local_120; local_2e0 <= CONCAT44(uStack_14c,in_stack_fffffffffffffeb0);
            local_2e0 = local_2e0 + 1) {
          lVar3 = (local_2e0 + -1) * local_e8[5] + 1;
          if (lVar3 + local_e8[5] + -1 < local_60) {
            local_348 = lVar3 + local_e8[5] + -1;
          }
          else {
            local_348 = local_60;
          }
          local_1b0 = local_348;
          local_210 = (local_2e0 + -1) * alStack_208[5];
          for (local_2e8 = local_128; local_2e8 <= (long)in_stack_fffffffffffffea8;
              local_2e8 = local_2e8 + 1) {
            tile = (char *)((local_2e8 + -1) * local_e8[4] + 1);
            if ((long)(tile + local_e8[4] + -1) < (long)local_68) {
              local_350 = tile + local_e8[4] + -1;
            }
            else {
              local_350 = local_68;
            }
            local_1b8 = local_350;
            local_218 = (local_2e8 + -1) * alStack_208[4] + local_210;
            for (local_2f0 = local_130; local_2f0 <= (long)in_stack_fffffffffffffea0;
                local_2f0 = local_2f0 + 1) {
              lVar3 = (local_2f0 + -1) * local_e8[3] + 1;
              if (lVar3 + local_e8[3] + -1 < local_70) {
                local_358 = lVar3 + local_e8[3] + -1;
              }
              else {
                local_358 = local_70;
              }
              local_1c0 = local_358;
              local_220 = (local_2f0 + -1) * alStack_208[3] + local_218;
              for (local_2f8 = local_138; local_2f8 <= (long)in_stack_fffffffffffffe98;
                  local_2f8 = local_2f8 + 1) {
                tfpixel_00 = (long *)((local_2f8 + -1) * local_e8[2] + 1);
                if ((long)tfpixel_00 + local_e8[2] + -1 < local_78) {
                  local_360 = (long)tfpixel_00 + local_e8[2] + -1;
                }
                else {
                  local_360 = local_78;
                }
                local_1c8 = local_360;
                local_228 = (local_2f8 + -1) * alStack_208[2] + local_220;
                status_00 = local_300;
                for (; (long)local_300 <= (long)in_stack_fffffffffffffe90;
                    local_300 = (int *)((long)local_300 + 1)) {
                  tlpixel_00 = (long *)(((long)local_300 + -1) * local_e8[1] + 1);
                  if ((long)tlpixel_00 + local_e8[1] + -1 < local_80) {
                    local_368 = (long)tlpixel_00 + local_e8[1] + -1;
                  }
                  else {
                    local_368 = local_80;
                  }
                  local_1d0 = local_368;
                  local_230 = ((long)local_300 + -1) * alStack_208[1] + local_228;
                  nullarray_00 = local_308;
                  for (; (long)local_308 <= local_178; local_308 = local_308 + 1) {
                    bnullarray_00 = (char *)((long)(local_308 + -1) * local_e8[0] + 1);
                    if ((long)(bnullarray_00 + local_e8[0] + -1) < (long)local_88) {
                      local_370 = bnullarray_00 + local_e8[0] + -1;
                    }
                    else {
                      local_370 = local_88;
                    }
                    local_1d8 = local_370;
                    iVar2 = imcomp_test_overlap(in_stack_fffffffffffffd50,in_stack_fffffffffffffd48,
                                                (long *)in_stack_fffffffffffffd40,
                                                (long *)CONCAT44(in_stack_fffffffffffffd3c,
                                                                 in_stack_fffffffffffffd38),
                                                (long *)CONCAT44(in_stack_fffffffffffffd34,
                                                                 in_stack_fffffffffffffd30),
                                                in_stack_fffffffffffffd28,in_stack_fffffffffffffd60)
                    ;
                    if (iVar2 != 0) {
                      imcomp_decompress_tile
                                (in_stack_fffffffffffffd40,in_stack_fffffffffffffd3c,
                                 in_stack_fffffffffffffd38,in_stack_fffffffffffffd34,
                                 in_stack_fffffffffffffd30,in_stack_fffffffffffffd28,
                                 in_stack_fffffffffffffd60,in_stack_fffffffffffffd68,
                                 in_stack_fffffffffffffd70,in_stack_fffffffffffffd78);
                      imcomp_copy_overlap(tile,(int)((ulong)lVar3 >> 0x20),(int)lVar3,tfpixel_00,
                                          tlpixel_00,bnullarray_00,in_stack_fffffffffffffe90,
                                          in_stack_fffffffffffffe98,in_stack_fffffffffffffea0,
                                          in_stack_fffffffffffffea8,in_stack_fffffffffffffeb0,
                                          nullarray_00,status_00);
                    }
                  }
                  local_308 = nullarray_00;
                }
                local_300 = status_00;
              }
            }
          }
        }
        if (local_54 == 2) {
          free(local_330);
        }
        free(local_328);
        local_24 = *in_stack_00000028;
      }
    }
  }
  else {
    local_24 = *in_stack_00000028;
  }
  return local_24;
}

Assistant:

int fits_read_compressed_img(fitsfile *fptr,   /* I - FITS file pointer      */
            int  datatype,  /* I - datatype of the array to be returned      */
            LONGLONG  *infpixel, /* I - 'bottom left corner' of the subsection    */
            LONGLONG  *inlpixel, /* I - 'top right corner' of the subsection      */
            long  *ininc,    /* I - increment to be applied in each dimension */
            int  nullcheck,  /* I - 0 for no null checking                   */
                              /*     1: set undefined pixels = nullval       */
                              /*     2: set nullarray=1 for undefined pixels */
            void *nullval,    /* I - value for undefined pixels              */
            void *array,      /* O - array of values that are returned       */
            char *nullarray,  /* O - array of flags = 1 if nullcheck = 2     */
            int  *anynul,     /* O - set to 1 if any values are null; else 0 */
            int  *status)     /* IO - error status                           */
/*
   Read a section of a compressed image;  Note: lpixel may be larger than the 
   size of the uncompressed image.  Only the pixels within the image will be
   returned.
*/
{
    long naxis[MAX_COMPRESS_DIM], tiledim[MAX_COMPRESS_DIM];
    long tilesize[MAX_COMPRESS_DIM], thistilesize[MAX_COMPRESS_DIM];
    long ftile[MAX_COMPRESS_DIM], ltile[MAX_COMPRESS_DIM];
    long tfpixel[MAX_COMPRESS_DIM], tlpixel[MAX_COMPRESS_DIM];
    long rowdim[MAX_COMPRESS_DIM], offset[MAX_COMPRESS_DIM],ntemp;
    long fpixel[MAX_COMPRESS_DIM], lpixel[MAX_COMPRESS_DIM];
    long inc[MAX_COMPRESS_DIM];
    long i5, i4, i3, i2, i1, i0, irow;
    int ii, ndim, pixlen, tilenul=0;
    void *buffer;
    char *bnullarray = 0;
    double testnullval = 0.;

    if (*status > 0) 
        return(*status);

    if (!fits_is_compressed_image(fptr, status) )
    {
        ffpmsg("CHDU is not a compressed image (fits_read_compressed_img)");
        return(*status = DATA_DECOMPRESSION_ERR);
    }

    /* get temporary space for uncompressing one image tile */
    if (datatype == TSHORT)
    {
       buffer =  malloc ((fptr->Fptr)->maxtilelen * sizeof (short)); 
       pixlen = sizeof(short);
       if (nullval)
           testnullval = *(short *) nullval;
    }
    else if (datatype == TINT)
    {
       buffer =  malloc ((fptr->Fptr)->maxtilelen * sizeof (int));
       pixlen = sizeof(int);
       if (nullval)
           testnullval = *(int *) nullval;
    }
    else if (datatype == TLONG)
    {
       buffer =  malloc ((fptr->Fptr)->maxtilelen * sizeof (long));
       pixlen = sizeof(long);
       if (nullval)
           testnullval = *(long *) nullval;
    }
    else if (datatype == TFLOAT)
    {
       buffer =  malloc ((fptr->Fptr)->maxtilelen * sizeof (float));
       pixlen = sizeof(float);
       if (nullval)
           testnullval = *(float *) nullval;
    }
    else if (datatype == TDOUBLE)
    {
       buffer =  malloc ((fptr->Fptr)->maxtilelen * sizeof (double));
       pixlen = sizeof(double);
       if (nullval)
           testnullval = *(double *) nullval;
    }
    else if (datatype == TUSHORT)
    {
       buffer =  malloc ((fptr->Fptr)->maxtilelen * sizeof (unsigned short));
       pixlen = sizeof(short);
       if (nullval)
           testnullval = *(unsigned short *) nullval;
    }
    else if (datatype == TUINT)
    {
       buffer =  malloc ((fptr->Fptr)->maxtilelen * sizeof (unsigned int));
       pixlen = sizeof(int);
       if (nullval)
           testnullval = *(unsigned int *) nullval;
    }
    else if (datatype == TULONG)
    {
       buffer =  malloc ((fptr->Fptr)->maxtilelen * sizeof (unsigned long));
       pixlen = sizeof(long);
       if (nullval)
           testnullval = *(unsigned long *) nullval;
    }
    else if (datatype == TBYTE || datatype == TSBYTE)
    {
       buffer =  malloc ((fptr->Fptr)->maxtilelen * sizeof (char));
       pixlen = 1;
       if (nullval)
           testnullval = *(unsigned char *) nullval;
    }
    else
    {
        ffpmsg("unsupported datatype for uncompressing image");
        return(*status = BAD_DATATYPE);
    }

    /* If nullcheck ==1 and nullval == 0, then this means that the */
    /* calling routine does not want to check for null pixels in the array */
    if (nullcheck == 1 && testnullval == 0.)
        nullcheck = 0;

    if (buffer == NULL)
    {
	    ffpmsg("Out of memory (fits_read_compress_img)");
	    return (*status = MEMORY_ALLOCATION);
    }
	
    /* allocate memory for a null flag array, if needed */
    if (nullcheck == 2)
    {
        bnullarray = calloc ((fptr->Fptr)->maxtilelen, sizeof (char));

        if (bnullarray == NULL)
        {
	    ffpmsg("Out of memory (fits_read_compress_img)");
            free(buffer);
	    return (*status = MEMORY_ALLOCATION);
        }
    }

    /* initialize all the arrays */
    for (ii = 0; ii < MAX_COMPRESS_DIM; ii++)
    {
        naxis[ii] = 1;
        tiledim[ii] = 1;
        tilesize[ii] = 1;
        ftile[ii] = 1;
        ltile[ii] = 1;
        rowdim[ii] = 1;
    }

    ndim = (fptr->Fptr)->zndim;
    ntemp = 1;
    for (ii = 0; ii < ndim; ii++)
    {
        /* support for mirror-reversed image sections */
        if (infpixel[ii] <= inlpixel[ii])
        {
           fpixel[ii] = (long) infpixel[ii];
           lpixel[ii] = (long) inlpixel[ii];
           inc[ii]    = ininc[ii];
        }
        else
        {
           fpixel[ii] = (long) inlpixel[ii];
           lpixel[ii] = (long) infpixel[ii];
           inc[ii]    = -ininc[ii];
        }

        /* calc number of tiles in each dimension, and tile containing */
        /* the first and last pixel we want to read in each dimension  */
        naxis[ii] = (fptr->Fptr)->znaxis[ii];
        if (fpixel[ii] < 1)
        {
            if (nullcheck == 2)
            {
                free(bnullarray);
            }
            free(buffer);
            return(*status = BAD_PIX_NUM);
        }

        tilesize[ii] = (fptr->Fptr)->tilesize[ii];
        tiledim[ii] = (naxis[ii] - 1) / tilesize[ii] + 1;
        ftile[ii]   = (fpixel[ii] - 1)   / tilesize[ii] + 1;
        ltile[ii]   = minvalue((lpixel[ii] - 1) / tilesize[ii] + 1, 
                                tiledim[ii]);
        rowdim[ii]  = ntemp;  /* total tiles in each dimension */
        ntemp *= tiledim[ii];
    }

    if (anynul)
       *anynul = 0;  /* initialize */

    /* support up to 6 dimensions for now */
    /* tfpixel and tlpixel are the first and last image pixels */
    /* along each dimension of the compression tile */
    for (i5 = ftile[5]; i5 <= ltile[5]; i5++)
    {
     tfpixel[5] = (i5 - 1) * tilesize[5] + 1;
     tlpixel[5] = minvalue(tfpixel[5] + tilesize[5] - 1, 
                            naxis[5]);
     thistilesize[5] = tlpixel[5] - tfpixel[5] + 1;
     offset[5] = (i5 - 1) * rowdim[5];
     for (i4 = ftile[4]; i4 <= ltile[4]; i4++)
     {
      tfpixel[4] = (i4 - 1) * tilesize[4] + 1;
      tlpixel[4] = minvalue(tfpixel[4] + tilesize[4] - 1, 
                            naxis[4]);
      thistilesize[4] = thistilesize[5] * (tlpixel[4] - tfpixel[4] + 1);
      offset[4] = (i4 - 1) * rowdim[4] + offset[5];
      for (i3 = ftile[3]; i3 <= ltile[3]; i3++)
      {
        tfpixel[3] = (i3 - 1) * tilesize[3] + 1;
        tlpixel[3] = minvalue(tfpixel[3] + tilesize[3] - 1, 
                              naxis[3]);
        thistilesize[3] = thistilesize[4] * (tlpixel[3] - tfpixel[3] + 1);
        offset[3] = (i3 - 1) * rowdim[3] + offset[4];
        for (i2 = ftile[2]; i2 <= ltile[2]; i2++)
        {
          tfpixel[2] = (i2 - 1) * tilesize[2] + 1;
          tlpixel[2] = minvalue(tfpixel[2] + tilesize[2] - 1, 
                                naxis[2]);
          thistilesize[2] = thistilesize[3] * (tlpixel[2] - tfpixel[2] + 1);
          offset[2] = (i2 - 1) * rowdim[2] + offset[3];
          for (i1 = ftile[1]; i1 <= ltile[1]; i1++)
          {
            tfpixel[1] = (i1 - 1) * tilesize[1] + 1;
            tlpixel[1] = minvalue(tfpixel[1] + tilesize[1] - 1, 
                                  naxis[1]);
            thistilesize[1] = thistilesize[2] * (tlpixel[1] - tfpixel[1] + 1);
            offset[1] = (i1 - 1) * rowdim[1] + offset[2];
            for (i0 = ftile[0]; i0 <= ltile[0]; i0++)
            {
             tfpixel[0] = (i0 - 1) * tilesize[0] + 1;
             tlpixel[0] = minvalue(tfpixel[0] + tilesize[0] - 1, 
                                    naxis[0]);
              thistilesize[0] = thistilesize[1] * (tlpixel[0] - tfpixel[0] + 1);
              /* calculate row of table containing this tile */
              irow = i0 + offset[1];

/*
printf("row %d, %d %d, %d %d, %d %d; %d\n",
              irow, tfpixel[0],tlpixel[0],tfpixel[1],tlpixel[1],tfpixel[2],tlpixel[2],
	      thistilesize[0]);
*/   
              /* test if there are any intersecting pixels in this tile and the output image */
              if (imcomp_test_overlap(ndim, tfpixel, tlpixel, 
                      fpixel, lpixel, inc, status)) {
                  /* read and uncompress this row (tile) of the table */
                  /* also do type conversion and undefined pixel substitution */
                  /* at this point */

                  imcomp_decompress_tile(fptr, irow, thistilesize[0],
                    datatype, nullcheck, nullval, buffer, bnullarray, &tilenul,
                     status);

                  if (tilenul && anynul)
                      *anynul = 1;  /* there are null pixels */
/*
printf(" pixlen=%d, ndim=%d, %d %d %d, %d %d %d, %d %d %d\n",
     pixlen, ndim, fpixel[0],lpixel[0],inc[0],fpixel[1],lpixel[1],inc[1],
     fpixel[2],lpixel[2],inc[2]);
*/
                  /* copy the intersecting pixels from this tile to the output */
                  imcomp_copy_overlap(buffer, pixlen, ndim, tfpixel, tlpixel, 
                     bnullarray, array, fpixel, lpixel, inc, nullcheck, 
                     nullarray, status);
               }
            }
          }
        }
      }
     }
    }
    if (nullcheck == 2)
    {
        free(bnullarray);
    }
    free(buffer);

    return(*status);
}